

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLSGetNumPrecSolves(void *arkode_mem,long *npsolves)

{
  int iVar1;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkLs_AccessLMem(arkode_mem,"arkLSGetNumPrecSolves",&local_10,&local_18);
  if (iVar1 == 0) {
    *npsolves = local_18->nps;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkLSGetNumPrecSolves(void *arkode_mem, long int *npsolves)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  int       retval;

  /* access ARKLsMem structure; set output value and return */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSGetNumPrecSolves",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  *npsolves = arkls_mem->nps;
  return(ARKLS_SUCCESS);
}